

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  bool ok;
  
  bVar1 = test();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"your code is ok!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"you have a bug of some kind");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main() {
  bool ok(test());
  if (ok)
    cout << "your code is ok!" << endl;
  else
    cout << "you have a bug of some kind" << endl;
  return 0;
}